

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL3_glfw::GLCompiledProgram::addUniqueTexture
          (GLCompiledProgram *this,ShaderSpecTexture *newTexture)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pGVar2;
  size_t __n;
  pointer pcVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
  *this_00;
  pointer __rhs;
  bool bVar7;
  bool bVar8;
  string local_a8;
  GLCompiledProgram *local_88;
  GLShaderTexture local_80;
  
  __rhs = (this->textures).
          super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pGVar2 = (this->textures).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_88 = this;
  do {
    bVar7 = __rhs == pGVar2;
    if (bVar7) {
LAB_00283619:
      this_00 = &local_88->textures;
      paVar1 = &local_80.name.field_2;
      pcVar3 = (newTexture->name)._M_dataplus._M_p;
      local_80.name._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,pcVar3,pcVar3 + (newTexture->name)._M_string_length);
      local_80.dim = newTexture->dim;
      local_80.index = 0x309;
      local_80.isSet = false;
      local_80.textureBuffer = (GLTextureBuffer *)0x0;
      local_80.textureBufferOwned.
      super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLTextureBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_80.textureBufferOwned.
      super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLTextureBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_80.location = 0x309;
      std::
      vector<polyscope::render::backend_openGL3_glfw::GLShaderTexture,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderTexture>_>
      ::emplace_back<polyscope::render::backend_openGL3_glfw::GLShaderTexture>(this_00,&local_80);
      if (local_80.textureBufferOwned.
          super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLTextureBuffer,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.textureBufferOwned.
                   super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLTextureBuffer,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_80.name._M_dataplus._M_p);
      }
      return;
    }
    __n = (__rhs->name)._M_string_length;
    if (__n == (newTexture->name)._M_string_length) {
      if (__n == 0) {
        bVar8 = true;
      }
      else {
        iVar4 = bcmp((__rhs->name)._M_dataplus._M_p,(newTexture->name)._M_dataplus._M_p,__n);
        bVar8 = iVar4 == 0;
      }
    }
    else {
      bVar8 = false;
    }
    if (bVar8) {
      if (__rhs->dim != newTexture->dim) {
        std::operator+(&local_80.name,"texture ",&__rhs->name);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_80);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_a8.field_2._M_allocated_capacity = *psVar6;
          local_a8.field_2._8_8_ = plVar5[3];
        }
        else {
          local_a8.field_2._M_allocated_capacity = *psVar6;
          local_a8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_a8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        exception(&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80.name._M_dataplus._M_p != &local_80.name.field_2) {
          operator_delete(local_80.name._M_dataplus._M_p);
        }
      }
      if (bVar8) {
        if (!bVar7) {
          return;
        }
        goto LAB_00283619;
      }
    }
    __rhs = __rhs + 1;
  } while( true );
}

Assistant:

void GLCompiledProgram::addUniqueTexture(ShaderSpecTexture newTexture) {
  for (GLShaderTexture& t : textures) {
    if (t.name == newTexture.name) {

      // if it occurs twice, confirm that the occurences match
      if (t.dim != newTexture.dim)
        exception("texture " + t.name + " appears twice in program with different dimensions");

      return;
    }
  }
  textures.push_back(GLShaderTexture{newTexture.name, newTexture.dim, 777, false, nullptr, nullptr, 777});
}